

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_unk(Parser *this)

{
  char *pcVar1;
  Tree *pTVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  State *pSVar13;
  uint uVar14;
  long lVar15;
  size_t len_;
  char cVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  ro_substr chars_02;
  csubstr fmt;
  csubstr fmt_00;
  ro_substr chars_03;
  csubstr rem;
  csubstr fmt_01;
  csubstr cVar20;
  bool is_quoted;
  basic_substring<const_char> trimmed;
  char msg [39];
  basic_substring<const_char> local_118;
  bool local_f9;
  csubstr local_f8;
  basic_substring<const_char> local_e8;
  char local_d8 [40];
  ulong local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pSVar13 = this->m_state;
  local_118.str = (pSVar13->line_contents).rem.str;
  local_118.len = (pSVar13->line_contents).rem.len;
  if (pSVar13->node_id == 0xffffffffffffffff) {
    bVar8 = true;
  }
  else {
    pTVar2 = this->m_tree;
    if (pTVar2->m_cap <= pSVar13->node_id) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        uVar9 = (*pcVar3)();
        return (bool)uVar9;
      }
      local_e8.str = (char *)0x0;
      local_e8.len = 0x4b74;
      local_d8[0] = '\0';
      local_d8[1] = '\0';
      local_d8[2] = '\0';
      local_d8[3] = '\0';
      local_d8[4] = '\0';
      local_d8[5] = '\0';
      local_d8[6] = '\0';
      local_d8[7] = '\0';
      local_d8[8] = 'Z';
      local_d8[9] = '\x7f';
      local_d8[10] = '\x1f';
      local_d8[0xb] = '\0';
      local_d8[0xc] = '\0';
      local_d8[0xd] = '\0';
      local_d8[0xe] = '\0';
      local_d8[0xf] = '\0';
      local_d8[0x10] = 0x65;
      local_d8[0x11] = '\0';
      local_d8[0x12] = '\0';
      local_d8[0x13] = '\0';
      local_d8[0x14] = '\0';
      local_d8[0x15] = '\0';
      local_d8[0x16] = '\0';
      local_d8[0x17] = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
      pSVar13 = this->m_state;
    }
    bVar8 = pTVar2->m_buf == (NodeData *)0x0;
  }
  uVar14 = pSVar13->flags;
  if ((uVar14 >> 0xc & 1) != 0) {
    iVar11 = basic_substring<const_char>::compare(&local_118,"---",3);
    if (iVar11 == 0) {
LAB_001cf760:
      cVar20.len = local_118.len;
      cVar20.str = local_118.str;
      _start_new_doc(this,cVar20);
      return true;
    }
    if (3 < local_118.len) {
      lVar15 = 0;
      do {
        if (local_118.str[lVar15] != "--- "[lVar15]) goto LAB_001cf5f0;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      goto LAB_001cf760;
    }
LAB_001cf5f0:
    local_f8 = basic_substring<const_char>::triml(&local_118,' ');
    uVar18 = local_f8.len;
    pcVar17 = local_f8.str;
    iVar11 = basic_substring<const_char>::compare(&local_f8,"---",3);
    if (iVar11 == 0) {
LAB_001cf7ca:
      if (local_118.len < uVar18) {
        builtin_strncpy(local_d8,"em.len >= trimmed.len)",0x17);
        local_e8.str = (char *)0x6166206b63656863;
        local_e8.len._0_1_ = 'i';
        local_e8.len._1_1_ = 'l';
        local_e8.len._2_1_ = 'e';
        local_e8.len._3_1_ = 'd';
        local_e8.len._4_1_ = ':';
        local_e8.len._5_1_ = ' ';
        local_e8.len._6_1_ = '(';
        local_e8.len._7_1_ = 'r';
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar3 = (code *)swi(3);
          uVar9 = (*pcVar3)();
          return (bool)uVar9;
        }
        local_58 = 0;
        uStack_50 = 0x6c35;
        local_48 = 0;
        pcStack_40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_38 = 0x65;
        auVar5 = ZEXT1224(ZEXT412(0x6c35) << 0x40);
        LVar6.name.str._0_4_ = 0x1f7f5a;
        LVar6.super_LineCol.offset = auVar5._0_8_;
        LVar6.super_LineCol.line = auVar5._8_8_;
        LVar6.super_LineCol.col = auVar5._16_8_;
        LVar6.name.str._4_4_ = 0;
        LVar6.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_e8,0x27,LVar6,(this->m_stack).m_callbacks.m_user_data);
        uVar18 = local_f8.len;
      }
      _line_progressed(this,local_118.len - uVar18);
      _start_new_doc(this,local_f8);
      _save_indentation(this,0);
      return true;
    }
    if (3 < uVar18) {
      lVar15 = 0;
      do {
        if (pcVar17[lVar15] != "--- "[lVar15]) goto LAB_001cf634;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      goto LAB_001cf7ca;
    }
LAB_001cf634:
    if (uVar18 < 3) {
LAB_001cf63e:
      chars_03.len = 2;
      chars_03.str = "#%";
      sVar12 = basic_substring<const_char>::first_of(&local_f8,chars_03,0);
      if (sVar12 == 0xffffffffffffffff) {
        sVar12 = this->m_state->indref;
        _push_level(this,false);
        _start_doc(this,true);
        this->m_state->indref = sVar12;
      }
    }
    else {
      lVar15 = 0;
      do {
        if (pcVar17[lVar15] != "\t..."[lVar15 + 1]) goto LAB_001cf63e;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      _end_stream(this);
    }
    if ((local_f8.len == 0) || (local_f8.str == (char *)0x0)) {
      builtin_strncpy(local_d8,"trimmed.empty())",0x11);
      local_e8.str = (char *)0x6166206b63656863;
      local_e8.len._0_1_ = 'i';
      local_e8.len._1_1_ = 'l';
      local_e8.len._2_1_ = 'e';
      local_e8.len._3_1_ = 'd';
      local_e8.len._4_1_ = ':';
      local_e8.len._5_1_ = ' ';
      local_e8.len._6_1_ = '(';
      local_e8.len._7_1_ = '!';
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar3 = (code *)swi(3);
        uVar9 = (*pcVar3)();
        return (bool)uVar9;
      }
      local_80 = 0;
      uStack_78 = 0x6c47;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar5 = ZEXT1224(ZEXT412(0x6c47) << 0x40);
      LVar7.name.str._0_4_ = 0x1f7f5a;
      LVar7.super_LineCol.offset = auVar5._0_8_;
      LVar7.super_LineCol.line = auVar5._8_8_;
      LVar7.super_LineCol.col = auVar5._16_8_;
      LVar7.name.str._4_4_ = 0;
      LVar7.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_e8,0x21,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    pSVar13 = this->m_state;
    uVar14 = pSVar13->flags;
  }
  if ((uVar14 & 0x10c) != 0) {
    builtin_strncpy(local_d8,"as_none(RNXT|RSEQ|RMAP))",0x19);
    local_e8.str = (char *)0x6166206b63656863;
    local_e8.len._0_1_ = 'i';
    local_e8.len._1_1_ = 'l';
    local_e8.len._2_1_ = 'e';
    local_e8.len._3_1_ = 'd';
    local_e8.len._4_1_ = ':';
    local_e8.len._5_1_ = ' ';
    local_e8.len._6_1_ = '(';
    local_e8.len._7_1_ = 'h';
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar3 = (code *)swi(3);
      uVar9 = (*pcVar3)();
      return (bool)uVar9;
    }
    local_a8 = 0;
    uStack_a0 = 0x6c4a;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x6c4a) << 0x40);
    LVar4.name.str._0_4_ = 0x1f7f5a;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_e8,0x29,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar13 = this->m_state;
  }
  if (pSVar13->indref != 0) {
    sVar12 = basic_substring<const_char>::first_not_of(&local_118,' ',0);
    if ((sVar12 != 0xffffffffffffffff) && (local_118.len < sVar12)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar3 = (code *)swi(3);
        uVar9 = (*pcVar3)();
        return (bool)uVar9;
      }
      handle_error(0x1f8007,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar12 == 0xffffffffffffffff) {
      local_e8.str = local_118.str;
      local_e8.len = local_118.len;
    }
    else {
      basic_substring<const_char>::basic_substring(&local_e8,local_118.str,sVar12);
    }
    sVar12 = this->m_state->indref;
    if (sVar12 <= local_e8.len) {
      _line_progressed(this,sVar12);
      uVar18 = this->m_state->indref;
      if (local_118.len < uVar18) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar3 = (code *)swi(3);
          uVar9 = (*pcVar3)();
          return (bool)uVar9;
        }
        handle_error(0x1f8007,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_e8,local_118.str + uVar18,local_118.len - uVar18);
      local_118.str = local_e8.str;
      local_118.len = local_e8.len;
    }
  }
  sVar12 = local_118.len;
  if (((1 < local_118.len) && (*local_118.str == '-')) && (local_118.str[1] == ' ')) {
    _move_key_anchor_to_val_anchor(this);
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar12 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar12;
      this->m_val_tag_indentation = this->m_key_tag_indentation;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
      this->m_key_tag_indentation = 0;
    }
    _push_level(this,false);
    _start_seq(this,bVar8);
LAB_001ceb1e:
    _save_indentation(this,0);
    sVar12 = 2;
    goto LAB_001ceccb;
  }
  iVar11 = basic_substring<const_char>::compare(&local_118,'-');
  if (iVar11 == 0) {
    _move_key_anchor_to_val_anchor(this);
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar12 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar12;
      this->m_val_tag_indentation = this->m_key_tag_indentation;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
      this->m_key_tag_indentation = 0;
    }
    _push_level(this,false);
    _start_seq(this,bVar8);
LAB_001cec42:
    _save_indentation(this,0);
    goto LAB_001cecc6;
  }
  if (sVar12 == 0) goto LAB_001cee2d;
  cVar16 = *local_118.str;
  if (cVar16 == '{') {
    _move_key_anchor_to_val_anchor(this);
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar12 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar12;
      this->m_val_tag_indentation = this->m_key_tag_indentation;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
      this->m_key_tag_indentation = 0;
    }
    _push_level(this,true);
    _start_map(this,bVar8);
    this->m_state->flags = this->m_state->flags & 0xffffff2fU | 0x50;
  }
  else {
    if (cVar16 != '[') {
      if (1 < sVar12) {
        if (cVar16 == ':') {
          if ((local_118.str[1] == ' ') && ((this->m_state->flags & 0x200) == 0)) {
            _move_key_anchor_to_val_anchor(this);
            if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
              sVar12 = (this->m_key_tag).len;
              (this->m_val_tag).str = (this->m_key_tag).str;
              (this->m_val_tag).len = sVar12;
              this->m_val_tag_indentation = this->m_key_tag_indentation;
              (this->m_key_tag).str = (char *)0x0;
              (this->m_key_tag).len = 0;
              this->m_key_tag_indentation = 0;
            }
            _push_level(this,false);
            _start_map(this,bVar8);
            _store_scalar_null(this,local_118.str);
            pSVar13 = this->m_state;
            uVar14 = pSVar13->flags & 0xffffff3fU | 0x80;
            goto LAB_001cee26;
          }
        }
        else if ((cVar16 == '?') && (local_118.str[1] == ' ')) {
          _move_key_anchor_to_val_anchor(this);
          if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
            sVar12 = (this->m_key_tag).len;
            (this->m_val_tag).str = (this->m_key_tag).str;
            (this->m_val_tag).len = sVar12;
            this->m_val_tag_indentation = this->m_key_tag_indentation;
            (this->m_key_tag).str = (char *)0x0;
            (this->m_key_tag).len = 0;
            this->m_key_tag_indentation = 0;
          }
          _push_level(this,false);
          _start_map(this,bVar8);
          pSVar13 = this->m_state;
          uVar14 = pSVar13->flags & 0xffffff1fU | 0x60;
LAB_001cee26:
          pSVar13->flags = uVar14;
          goto LAB_001ceb1e;
        }
      }
LAB_001cee2d:
      iVar11 = basic_substring<const_char>::compare(&local_118,':');
      if ((iVar11 == 0) && ((this->m_state->flags & 0x200) == 0)) {
        _move_key_anchor_to_val_anchor(this);
        if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
          sVar12 = (this->m_key_tag).len;
          (this->m_val_tag).str = (this->m_key_tag).str;
          (this->m_val_tag).len = sVar12;
          this->m_val_tag_indentation = this->m_key_tag_indentation;
          (this->m_key_tag).str = (char *)0x0;
          (this->m_key_tag).len = 0;
          this->m_key_tag_indentation = 0;
        }
        _push_level(this,false);
        _start_map(this,bVar8);
        _store_scalar_null(this,local_118.str);
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
        goto LAB_001cec42;
      }
      bVar10 = _handle_types(this);
      if (bVar10) {
        return true;
      }
      if (((local_118.len == 0) || (*local_118.str != '*')) &&
         (bVar10 = _handle_key_anchors_and_refs(this), bVar10)) {
        return true;
      }
      if ((this->m_state->flags & 0x200) == 0) {
        local_f8 = (csubstr)ZEXT816(0);
        uVar18 = (this->m_state->line_contents).indentation;
        bVar10 = _scan_scalar_unk(this,&local_f8,&local_f9);
        if (bVar10) {
          local_118.str = (this->m_state->line_contents).rem.str;
          local_118.len = (this->m_state->line_contents).rem.len;
          chars.len = 2;
          chars.str = " \t";
          sVar12 = basic_substring<const_char>::first_not_of(&local_118,chars,0);
          if (sVar12 - 1 < 0xfffffffffffffffe) {
            _line_progressed(this,sVar12);
            if (local_118.len < sVar12) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar3 = (code *)swi(3);
                uVar9 = (*pcVar3)();
                return (bool)uVar9;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_e8,local_118.str + sVar12,local_118.len - sVar12);
            local_118.str = local_e8.str;
            local_118.len = local_e8.len;
          }
          _store_scalar(this,local_f8,(uint)local_f9);
          if (((local_118.len < 2) || (*local_118.str != ':')) ||
             (sVar12 = 2, local_118.str[1] != ' ')) {
            sVar12 = 1;
            iVar11 = basic_substring<const_char>::compare(&local_118,":",1);
            if (iVar11 != 0) {
              return true;
            }
          }
          _push_level(this,false);
          _start_map(this,bVar8);
          pSVar13 = this->m_state;
        }
        else {
          if ((local_118.len == 0) || ((*local_118.str != ' ' && (*local_118.str != '\t')))) {
            return false;
          }
          chars_01.len = 2;
          chars_01.str = " \t";
          sVar12 = basic_substring<const_char>::first_not_of(&local_118,chars_01,0);
          if (sVar12 != 0xffffffffffffffff && local_118.len < sVar12) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              pcVar3 = (code *)swi(3);
              uVar9 = (*pcVar3)();
              return (bool)uVar9;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1569,"pos <= len || pos == npos");
          }
          if (sVar12 == 0xffffffffffffffff) {
            local_e8.str = local_118.str;
            local_e8.len = local_118.len;
          }
          else {
            basic_substring<const_char>::basic_substring(&local_e8,local_118.str,sVar12);
          }
          sVar12 = local_118.len;
          if (local_118.len == 0) {
            if (local_e8.len != 0) goto LAB_001cf366;
            sVar12 = 0;
          }
          else if (local_e8.str < local_118.str ||
                   local_118.str + local_118.len < local_e8.str + local_e8.len) {
LAB_001cf366:
            if (local_e8.str != (char *)0x0 && local_e8.len != 0) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar3 = (code *)swi(3);
                uVar9 = (*pcVar3)();
                return (bool)uVar9;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x159e,"is_super(subs) || subs.empty()");
            }
          }
          local_b0 = local_e8.len;
          pcVar17 = local_e8.str + local_e8.len;
          uVar19 = (long)pcVar17 - (long)local_118.str;
          uVar18 = 0;
          if ((local_118.str <= pcVar17) && (pcVar1 = local_118.str + sVar12, pcVar17 <= pcVar1)) {
            if (sVar12 < uVar19) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar3 = (code *)swi(3);
                uVar9 = (*pcVar3)();
                return (bool)uVar9;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x153a,"first >= 0 && first <= len");
            }
            uVar18 = (long)pcVar1 - (long)pcVar17;
            if ((uVar18 != 0xffffffffffffffff) && (sVar12 < uVar18)) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar3 = (code *)swi(3);
                uVar9 = (*pcVar3)();
                return (bool)uVar9;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
            }
            len_ = sVar12 - uVar19;
            if (uVar18 != 0xffffffffffffffff) {
              len_ = uVar18;
            }
            if ((pcVar1 != pcVar17) && (sVar12 < len_ + uVar19)) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar3 = (code *)swi(3);
                uVar9 = (*pcVar3)();
                return (bool)uVar9;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
            }
            basic_substring<const_char>::basic_substring(&local_e8,local_118.str + uVar19,len_);
            local_118.str = local_e8.str;
            uVar18 = local_e8.len;
          }
          pSVar13 = this->m_state;
          sVar12 = local_b0;
          local_118.len = uVar18;
          if (uVar18 < 3 || (pSVar13->flags & 1) == 0) goto LAB_001cf42f;
          lVar15 = 0;
          do {
            if (local_118.str[lVar15] != "---"[lVar15]) goto LAB_001cf42f;
            lVar15 = lVar15 + 1;
            uVar18 = local_b0;
          } while (lVar15 != 3);
        }
        pSVar13->indref = uVar18;
        goto LAB_001cf42f;
      }
      local_f8 = (csubstr)ZEXT816(0);
      bVar10 = _scan_scalar_unk(this,&local_f8,&local_f9);
      if (bVar10) {
        local_118.str = (this->m_state->line_contents).rem.str;
        local_118.len = (this->m_state->line_contents).rem.len;
        if (local_118.len != 0) {
          if ((*local_118.str == ' ') || (*local_118.str == '\t')) {
            chars_00.len = 2;
            chars_00.str = " \t";
            sVar12 = basic_substring<const_char>::first_not_of(&local_118,chars_00,0);
            if (local_118.len < sVar12) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
                pcVar3 = (code *)swi(3);
                uVar9 = (*pcVar3)();
                return (bool)uVar9;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1533,"first >= 0 && first <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_e8,local_118.str + sVar12,local_118.len - sVar12);
            local_118.str = local_e8.str;
            local_118.len = local_e8.len;
            _line_progressed(this,sVar12);
          }
          goto LAB_001cf0de;
        }
LAB_001cf1f2:
        iVar11 = basic_substring<const_char>::compare(&local_118,":",1);
        if (iVar11 != 0) {
LAB_001cf210:
          bVar8 = _handle_key_anchors_and_refs(this);
          sVar12 = local_118.len;
          pcVar17 = local_118.str;
          if (bVar8) {
            return true;
          }
          if (local_118.len != 0) {
            cVar16 = *local_118.str;
            if ((cVar16 != ' ') && (cVar16 != '\t')) {
              iVar11 = basic_substring<const_char>::compare(&local_118,"---",3);
              if (iVar11 != 0) {
                if (sVar12 < 4) {
LAB_001cf5ae:
                  if (cVar16 != '%') {
                    bVar8 = is_debugger_attached();
                    if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
                      pcVar3 = (code *)swi(3);
                      uVar9 = (*pcVar3)();
                      return (bool)uVar9;
                    }
                    fmt_01.len = 0x12;
                    fmt_01.str = "ERROR: parse error";
                    _err<>(this,fmt_01);
                    goto LAB_001cf50f;
                  }
                  goto LAB_001cf42f;
                }
                lVar15 = 0;
                do {
                  if (pcVar17[lVar15] != "--- "[lVar15]) goto LAB_001cf5ae;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 4);
              }
              rem.len = sVar12;
              rem.str = pcVar17;
              _start_new_doc(this,rem);
              return true;
            }
            chars_02.len = 2;
            chars_02.str = " \t";
            sVar12 = basic_substring<const_char>::first_not_of(&local_118,chars_02,0);
            if (sVar12 == 0xffffffffffffffff) {
              sVar12 = local_118.len;
            }
LAB_001cf42f:
            _line_progressed(this,sVar12);
            return true;
          }
          goto LAB_001cf50f;
        }
LAB_001cf31c:
        _start_map_unk(this,bVar8);
LAB_001cf502:
        sVar12 = 1;
      }
      else {
LAB_001cf0de:
        sVar12 = local_118.len;
        pcVar17 = local_118.str;
        if (local_118.len < 2) {
          if (local_118.len == 0) goto LAB_001cf1f2;
          cVar16 = *local_118.str;
          if (cVar16 != ',') {
            iVar11 = basic_substring<const_char>::compare(&local_118,":",1);
            if (iVar11 != 0) goto LAB_001cf46d;
            goto LAB_001cf31c;
          }
LAB_001cf287:
          _start_seq(this,bVar8);
          this->m_state->flags = this->m_state->flags | 0x10;
          cVar20 = _consume_scalar(this);
          _append_val(this,cVar20,0);
          goto LAB_001cf502;
        }
        if ((*local_118.str != ',') || (local_118.str[1] != ' ')) {
          if (*local_118.str == ':') {
            if (local_118.str[1] == ' ') {
              _start_map_unk(this,bVar8);
              goto LAB_001cf2d0;
            }
          }
          else if (*local_118.str == ',') goto LAB_001cf287;
          iVar11 = basic_substring<const_char>::compare(&local_118,":",1);
          if ((iVar11 != 0) &&
             (((sVar12 < 2 || (*local_118.str != ':')) ||
              ((local_118.str[1] != '\"' && (local_118.str[1] != '\'')))))) {
            cVar16 = *local_118.str;
            pcVar17 = local_118.str;
LAB_001cf46d:
            if (cVar16 == '}') {
              uVar14 = this->m_state->flags;
              if ((~uVar14 & 0x14) != 0) {
                bVar8 = is_debugger_attached();
                if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
                  pcVar3 = (code *)swi(3);
                  uVar9 = (*pcVar3)();
                  return (bool)uVar9;
                }
                fmt.len = 0x27;
                fmt.str = "ERROR: invalid token: not reading a map";
                _err<>(this,fmt);
                uVar14 = this->m_state->flags;
              }
              if ((uVar14 >> 9 & 1) == 0) {
                bVar8 = is_debugger_attached();
                if ((bVar8) && (bVar8 = is_debugger_attached(), bVar8)) {
                  pcVar3 = (code *)swi(3);
                  uVar9 = (*pcVar3)();
                  return (bool)uVar9;
                }
                fmt_00.len = 0x17;
                fmt_00.str = "ERROR: no scalar stored";
                _err<>(this,fmt_00);
              }
              _append_key_val(this,local_f8,0);
              _stop_map(this);
              goto LAB_001cf502;
            }
            if (2 < sVar12) {
              lVar15 = 0;
              do {
                if (pcVar17[lVar15] != "\t..."[lVar15 + 1]) goto LAB_001cf545;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              _end_stream(this);
              sVar12 = 3;
              goto LAB_001cf507;
            }
LAB_001cf545:
            if (cVar16 == '#') {
              _scan_comment(this);
              return true;
            }
            goto LAB_001cf210;
          }
          goto LAB_001cf31c;
        }
        _start_seq(this,bVar8);
        this->m_state->flags = this->m_state->flags | 0x10;
        cVar20 = _consume_scalar(this);
        _append_val(this,cVar20,0);
LAB_001cf2d0:
        sVar12 = 2;
      }
LAB_001cf507:
      _line_progressed(this,sVar12);
LAB_001cf50f:
      if (local_f8.str != (char *)0x0 && local_f8.len != 0) {
        _store_scalar(this,local_f8,(uint)local_f9);
        return true;
      }
      return true;
    }
    _move_key_anchor_to_val_anchor(this);
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar12 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar12;
      this->m_val_tag_indentation = this->m_key_tag_indentation;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
      this->m_key_tag_indentation = 0;
    }
    _push_level(this,true);
    _start_seq(this,bVar8);
    this->m_state->flags = this->m_state->flags | 0x10;
  }
LAB_001cecc6:
  sVar12 = 1;
LAB_001ceccb:
  _line_progressed(this,sVar12);
  return true;
}

Assistant:

bool Parser::_handle_unk()
{
    _c4dbgp("handle_unk");

    csubstr rem = m_state->line_contents.rem;
    const bool start_as_child = (node(m_state) == nullptr);

    if(C4_UNLIKELY(has_any(NDOC)))
    {
        if(rem == "---" || rem.begins_with("--- "))
        {
            _start_new_doc(rem);
            return true;
        }
        auto trimmed = rem.triml(' ');
        if(trimmed == "---" || trimmed.begins_with("--- "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len >= trimmed.len);
            _line_progressed(rem.len - trimmed.len);
            _start_new_doc(trimmed);
            _save_indentation();
            return true;
        }
        else if(trimmed.begins_with("..."))
        {
            _end_stream();
        }
        else if(trimmed.first_of("#%") == csubstr::npos) // neither a doc nor a tag
        {
            _c4dbgpf("starting implicit doc to accomodate unexpected tokens: '{}'", rem);
            size_t indref = m_state->indref;
            _push_level();
            _start_doc();
            _set_indentation(indref);
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, !trimmed.empty());
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT|RSEQ|RMAP));
    if(m_state->indref > 0)
    {
        csubstr ws = rem.left_of(rem.first_not_of(' '));
        if(m_state->indref <= ws.len)
        {
            _c4dbgpf("skipping base indentation of {}", m_state->indref);
            _line_progressed(m_state->indref);
            rem = rem.sub(m_state->indref);
        }
    }

    if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == '-')
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('['))
    {
        _c4dbgpf("it's a seq, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_seq(start_as_child);
        add_flags(FLOW);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('{'))
    {
        _c4dbgpf("it's a map, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_map(start_as_child);
        addrem_flags(FLOW|RKEY, RVAL);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with("? "))
    {
        _c4dbgpf("it's a map (as_child={}) + this key is complex", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        addrem_flags(RKEY|QMRK, RVAL);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem.begins_with(": ") && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == ':' && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(_handle_types())
    {
        return true;
    }
    else if(!rem.begins_with('*') && _handle_key_anchors_and_refs())
    {
        return true;
    }
    else if(has_all(SSCL))
    {
        _c4dbgpf("there's a stored scalar: '{}'", m_state->scalar);

        csubstr saved_scalar;
        bool is_quoted;
        if(_scan_scalar_unk(&saved_scalar, &is_quoted))
        {
            rem = m_state->line_contents.rem;
            _c4dbgpf("... and there's also a scalar next! '{}'", saved_scalar);
            if(rem.begins_with_any(" \t"))
            {
                size_t n = rem.first_not_of(" \t");
                _c4dbgpf("skipping {} spaces/tabs", n);
                rem = rem.sub(n);
                _line_progressed(n);
            }
        }

        _c4dbgpf("rem='{}'", rem);

        if(rem.begins_with(", "))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(2);
        }
        else if(rem.begins_with(','))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(1);
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("got a ': ' -- it's a map (as_child={})", start_as_child);
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(2);
        }
        else if(rem == ":" || rem.begins_with(":\"") || rem.begins_with(":'"))
        {
            if(rem == ":") { _c4dbgpf("got a ':' -- it's a map (as_child={})", start_as_child); }
            else { _c4dbgpf("got a '{}' -- it's a map (as_child={})", rem.first(2), start_as_child); }
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(1); // advance only 1
        }
        else if(rem.begins_with('}'))
        {
            if(!has_all(RMAP|FLOW))
            {
                _c4err("invalid token: not reading a map");
            }
            if(!has_all(SSCL))
            {
                _c4err("no scalar stored");
            }
            _append_key_val(saved_scalar);
            _stop_map();
            _line_progressed(1);
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
        }
        else if(rem.begins_with('#'))
        {
            _c4dbgpf("it's a comment: '{}'", rem);
            _scan_comment();
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(" ") || rem.begins_with("\t"))
        {
            size_t n = rem.first_not_of(" \t");
            if(n == npos)
                n = rem.len;
            _c4dbgpf("has {} spaces/tabs, skip...", n);
            _line_progressed(n);
            return true;
        }
        else if(rem.empty())
        {
            // nothing to do
        }
        else if(rem == "---" || rem.begins_with("--- "))
        {
            _c4dbgp("caught ---: starting doc");
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with('%'))
        {
            _c4dbgp("caught a directive: ignoring...");
            _line_progressed(rem.len);
            return true;
        }
        else
        {
            _c4err("parse error");
        }

        if( ! saved_scalar.empty())
        {
            _store_scalar(saved_scalar, is_quoted);
        }

        return true;
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL));
        csubstr scalar;
        size_t indentation = m_state->line_contents.indentation; // save
        bool is_quoted;
        if(_scan_scalar_unk(&scalar, &is_quoted))
        {
            _c4dbgpf("got a {} scalar", is_quoted ? "quoted" : "");
            rem = m_state->line_contents.rem;
            {
                size_t first = rem.first_not_of(" \t");
                if(first && first != npos)
                {
                    _c4dbgpf("skip {} whitespace characters", first);
                   _line_progressed(first);
                   rem = rem.sub(first);
                }
            }
            _store_scalar(scalar, is_quoted);
            if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
            {
                _c4dbgpf("got a ': ' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(2); // call this AFTER saving the indentation
            }
            else if(rem == ":")
            {
                _c4dbgpf("got a ':' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(1); // call this AFTER saving the indentation
            }
            else
            {
                // we still don't know whether it's a seq or a map
                // so just store the scalar
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            csubstr ws = rem.left_of(rem.first_not_of(" \t"));
            rem = rem.right_of(ws);
            if(has_all(RTOP) && rem.begins_with("---"))
            {
                _c4dbgp("there's a doc starting, and it's indented");
                _set_indentation(ws.len);
            }
            _c4dbgpf("skipping {} spaces/tabs", ws.len);
            _line_progressed(ws.len);
            return true;
        }
    }

    return false;
}